

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

char * anm_make_unique_filename(char *name,char *anmname,int num)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  int n;
  int anmnamepfx;
  int namepfx;
  char *rv;
  char *p;
  int num_local;
  char *anmname_local;
  char *name_local;
  
  pcVar4 = util_shortname(name);
  rv = strrchr(pcVar4,0x2e);
  if (rv == (char *)0x0) {
    sVar5 = strlen(name);
    rv = name + sVar5;
  }
  uVar1 = (int)rv - (int)name;
  pcVar4 = util_shortname(anmname);
  rv = strrchr(pcVar4,0x2e);
  if (rv == (char *)0x0) {
    sVar5 = strlen(pcVar4);
    rv = pcVar4 + sVar5;
  }
  uVar2 = (int)rv - (int)pcVar4;
  iVar3 = snprintf((char *)0x0,0,"%.*s@%.*s@%d%s",(ulong)uVar1,name,(ulong)uVar2,pcVar4,num,
                   name + (int)uVar1);
  if (iVar3 == -1) {
    abort();
  }
  __s = (char *)malloc((long)(iVar3 + 1));
  if (__s == (char *)0x0) {
    abort();
  }
  snprintf(__s,(long)(iVar3 + 1),"%.*s@%.*s@%d%s",(ulong)uVar1,name,(ulong)uVar2,pcVar4,num,
           name + (int)uVar1);
  return __s;
}

Assistant:

static char *
anm_make_unique_filename(
    const char *name,
    const char *anmname,
    int num)
{
    const char *p;
    char *rv;
    int namepfx, anmnamepfx, n;

    /* split path from extension ("dir/file.png" -> "dir/file", ".png") */
    p = util_shortname(name);
    if (!(p = strrchr(p, '.')))
        p = name + strlen(name);
    namepfx = p - name;

    /* get basename of the anm file ("dir/file.anm" -> "file") */
    anmname = util_shortname(anmname);
    if (!(p = strrchr(anmname, '.')))
        p = anmname + strlen(anmname);
    anmnamepfx = p - anmname;

    n = snprintf(0, 0, "%.*s@%.*s@%d%s", namepfx, name, anmnamepfx, anmname, num, name+namepfx);
    if (n == -1)
        abort();
    rv = malloc(n+1);
    if (!rv)
        abort();
    snprintf(rv, n+1, "%.*s@%.*s@%d%s", namepfx, name, anmnamepfx, anmname, num, name+namepfx);
    return rv;
}